

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O3

bool __thiscall cmSourceFileLocation::Matches(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  cmMakefile *this_00;
  cmSourceFileLocation *this_01;
  bool bVar1;
  int iVar2;
  string *psVar3;
  string *psVar4;
  size_t __n;
  cmSourceFileLocation *loc_00;
  pointer pcVar5;
  size_type __n_00;
  string srcDir;
  string binDir;
  string local_60;
  string local_40;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0xa4,"bool cmSourceFileLocation::Matches(const cmSourceFileLocation &)");
  }
  if (this->AmbiguousExtension == loc->AmbiguousExtension) {
    if ((this->Name)._M_string_length != (loc->Name)._M_string_length) {
      return false;
    }
    bVar1 = cmsys::SystemTools::ComparePath(&this->Name,&loc->Name);
  }
  else {
    loc_00 = loc;
    this_01 = this;
    if (this->AmbiguousExtension != false) {
      loc_00 = this;
      this_01 = loc;
    }
    bVar1 = MatchesAmbiguousExtension(this_01,loc_00);
  }
  if (bVar1 == false) {
    return false;
  }
  if (this->AmbiguousDirectory == false) {
    psVar4 = &loc->Directory;
    if (loc->AmbiguousDirectory != false) {
      psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(loc->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_60,psVar4,psVar3);
      psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(loc->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_40,psVar4,psVar3);
      __n_00 = (this->Directory)._M_string_length;
      if ((local_60._M_string_length != __n_00) ||
         ((local_60._M_string_length != 0 &&
          (iVar2 = bcmp(local_60._M_dataplus._M_p,(this->Directory)._M_dataplus._M_p,
                        local_60._M_string_length), iVar2 != 0)))) {
        if (local_40._M_string_length != __n_00) goto LAB_001ad28c;
        if (__n_00 != 0) {
          pcVar5 = (this->Directory)._M_dataplus._M_p;
          goto LAB_001ad27b;
        }
      }
      goto LAB_001ad290;
    }
    __n = (this->Directory)._M_string_length;
    if (__n != (loc->Directory)._M_string_length) {
      return false;
    }
    if (__n == 0) goto LAB_001ad2ce;
    pcVar5 = (psVar4->_M_dataplus)._M_p;
  }
  else {
    if (loc->AmbiguousDirectory == false) {
      psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_60,&this->Directory,psVar4);
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_40,&this->Directory,psVar4);
      __n_00 = (loc->Directory)._M_string_length;
      if ((local_60._M_string_length == __n_00) &&
         ((local_60._M_string_length == 0 ||
          (iVar2 = bcmp(local_60._M_dataplus._M_p,(loc->Directory)._M_dataplus._M_p,
                        local_60._M_string_length), iVar2 == 0)))) {
LAB_001ad290:
        bVar1 = true;
      }
      else {
        if (local_40._M_string_length == __n_00) {
          if (__n_00 != 0) {
            pcVar5 = (loc->Directory)._M_dataplus._M_p;
LAB_001ad27b:
            iVar2 = bcmp(local_40._M_dataplus._M_p,pcVar5,__n_00);
            if (iVar2 != 0) goto LAB_001ad28c;
          }
          goto LAB_001ad290;
        }
LAB_001ad28c:
        bVar1 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (!bVar1) {
        return false;
      }
      goto LAB_001ad2ce;
    }
    this_00 = this->Makefile;
    if (this_00 != loc->Makefile) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "Matches error: Each side has a directory relative to a different location. This can occur when referencing a source file from a different directory.  This is not yet allowed."
                 ,"");
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return false;
      }
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      return false;
    }
    __n = (this->Directory)._M_string_length;
    if (__n != (loc->Directory)._M_string_length) {
      return false;
    }
    if (__n == 0) goto LAB_001ad2ce;
    pcVar5 = (loc->Directory)._M_dataplus._M_p;
  }
  iVar2 = bcmp((this->Directory)._M_dataplus._M_p,pcVar5,__n);
  if (iVar2 != 0) {
    return false;
  }
LAB_001ad2ce:
  Update(this,loc);
  return true;
}

Assistant:

bool cmSourceFileLocation::Matches(cmSourceFileLocation const& loc)
{
  assert(this->Makefile);
  if (this->AmbiguousExtension == loc.AmbiguousExtension) {
    // Both extensions are similarly ambiguous.  Since only the old fixed set
    // of extensions will be tried, the names must match at this point to be
    // the same file.
    if (this->Name.size() != loc.Name.size() ||
        !cmSystemTools::ComparePath(this->Name, loc.Name)) {
      return false;
    }
  } else {
    const cmSourceFileLocation* loc1;
    const cmSourceFileLocation* loc2;
    if (this->AmbiguousExtension) {
      // Only "this" extension is ambiguous.
      loc1 = &loc;
      loc2 = this;
    } else {
      // Only "loc" extension is ambiguous.
      loc1 = this;
      loc2 = &loc;
    }
    if (!loc1->MatchesAmbiguousExtension(*loc2)) {
      return false;
    }
  }

  if (!this->AmbiguousDirectory && !loc.AmbiguousDirectory) {
    // Both sides have absolute directories.
    if (this->Directory != loc.Directory) {
      return false;
    }
  } else if (this->AmbiguousDirectory && loc.AmbiguousDirectory) {
    if (this->Makefile == loc.Makefile) {
      // Both sides have directories relative to the same location.
      if (this->Directory != loc.Directory) {
        return false;
      }
    } else {
      // Each side has a directory relative to a different location.
      // This can occur when referencing a source file from a different
      // directory.  This is not yet allowed.
      this->Makefile->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "Matches error: Each side has a directory relative to a different "
        "location. This can occur when referencing a source file from a "
        "different directory.  This is not yet allowed.");
      return false;
    }
  } else if (this->AmbiguousDirectory) {
    // Compare possible directory combinations.
    std::string const srcDir = cmSystemTools::CollapseFullPath(
      this->Directory, this->Makefile->GetCurrentSourceDirectory());
    std::string const binDir = cmSystemTools::CollapseFullPath(
      this->Directory, this->Makefile->GetCurrentBinaryDirectory());
    if (srcDir != loc.Directory && binDir != loc.Directory) {
      return false;
    }
  } else if (loc.AmbiguousDirectory) {
    // Compare possible directory combinations.
    std::string const srcDir = cmSystemTools::CollapseFullPath(
      loc.Directory, loc.Makefile->GetCurrentSourceDirectory());
    std::string const binDir = cmSystemTools::CollapseFullPath(
      loc.Directory, loc.Makefile->GetCurrentBinaryDirectory());
    if (srcDir != this->Directory && binDir != this->Directory) {
      return false;
    }
  }

  // File locations match.
  this->Update(loc);
  return true;
}